

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,rect<int> *destRect,rect<int> *clip,SColor *colors,
          u32 timeTicks,bool loop)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  pointer prVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  undefined8 in_RAX;
  undefined4 uVar8;
  undefined4 extraout_var;
  uint uVar9;
  ulong uVar10;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  lVar2 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
  if (index < (uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar2) >> 3)
                    * -0x33333333)) {
    uVar6 = (ulong)index;
    lVar3 = *(long *)(lVar2 + uVar6 * 0x28);
    uVar10 = (ulong)(*(long *)(lVar2 + 8 + uVar6 * 0x28) - lVar3) >> 3;
    uVar9 = (uint)uVar10;
    if (uVar9 != 0) {
      uVar1 = *(uint *)(lVar2 + uVar6 * 0x28 + 0x20);
      if (uVar1 == 0) {
        uVar10 = 0;
      }
      else {
        uVar5 = (ulong)timeTicks / (ulong)uVar1;
        if (loop) {
          uVar10 = uVar5 % (uVar10 & 0xffffffff);
        }
        else {
          uVar10 = (ulong)(uVar9 - 1);
          if ((uint)uVar5 < uVar9) {
            uVar10 = uVar5;
          }
        }
      }
      iVar7 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                        (this,(ulong)*(uint *)(lVar3 + uVar10 * 8));
      if (CONCAT44(extraout_var,iVar7) != 0) {
        prVar4 = (this->Rectangles).m_data.
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 + uVar6 * 0x28)
                          + 4 + uVar10 * 8);
        if (uVar9 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                         super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)prVar4)
                          >> 4)) {
          (*this->Driver->_vptr_IVideoDriver[0x32])
                    (this->Driver,CONCAT44(extraout_var,iVar7),destRect,prVar4 + uVar9,clip,colors,
                     CONCAT44(uVar8,1));
        }
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::rect<s32> &destRect,
		const core::rect<s32> *clip, const video::SColor *const colors,
		u32 timeTicks, bool loop)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, timeTicks, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	Driver->draw2DImage(tex, destRect, Rectangles[rn], clip, colors, true);
}